

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flying_cheat.cc
# Opt level: O2

void __thiscall FlyingCheat::disable(FlyingCheat *this)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  
  LOCK();
  (this->super_Cheat).active._M_base._M_i = false;
  UNLOCK();
  plVar2 = (long *)dlsym(0xffffffffffffffff,"GameWorld");
  if (*plVar2 == 0) {
    poVar3 = (ostream *)&std::cerr;
    pcVar5 = "Couldn\'t locate \'GameWorld\' symbol";
  }
  else {
    lVar1 = *(long *)(*plVar2 + 0xd8);
    lVar4 = lVar1 + -0xa8;
    if (lVar1 == 0) {
      lVar4 = 0;
    }
    *(undefined8 *)(lVar4 + 0x2e4) = *(undefined8 *)&this->m_jumpSpeed;
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&module_name_abi_cxx11_);
    pcVar5 = " disabled";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void FlyingCheat::disable()
{
    this->active = false;
    // Get the game world object
    ClientWorld *world = *((ClientWorld**)(dlsym(RTLD_NEXT, "GameWorld")));
    if (world == NULL) {
        std::cerr << "Couldn't locate 'GameWorld' symbol" << std::endl;
        return;
    }

    // Reset
    Player *player = (Player *)(world->m_activePlayer.m_object); 
    player->m_jumpSpeed = this->m_jumpSpeed;
    player->m_jumpHoldTime = this->m_jumpHoldTime;

    std::cout << module_name << " disabled" << std::endl;
}